

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLErrorCodes.hpp
# Opt level: O0

ErrTypes xercesc_4_0::XMLErrs::errorType(Codes toCheck)

{
  undefined4 local_c;
  Codes toCheck_local;
  
  if (((int)toCheck < 1) || (0xb < (int)toCheck)) {
    if (((int)toCheck < 0x9b) || (0x11f < (int)toCheck)) {
      if (((int)toCheck < 0xc) || (0x9a < (int)toCheck)) {
        local_c = ErrTypes_Unknown;
      }
      else {
        local_c = ErrType_Error;
      }
    }
    else {
      local_c = ErrType_Fatal;
    }
  }
  else {
    local_c = ErrType_Warning;
  }
  return local_c;
}

Assistant:

static XMLErrorReporter::ErrTypes errorType(const XMLErrs::Codes toCheck)
    {
       if ((toCheck >= W_LowBounds) && (toCheck <= W_HighBounds))
           return XMLErrorReporter::ErrType_Warning;
       else if ((toCheck >= F_LowBounds) && (toCheck <= F_HighBounds))
            return XMLErrorReporter::ErrType_Fatal;
       else if ((toCheck >= E_LowBounds) && (toCheck <= E_HighBounds))
            return XMLErrorReporter::ErrType_Error;
       return XMLErrorReporter::ErrTypes_Unknown;
    }